

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_CanSeek(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *target;
  AActor *this;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00431cd8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00431cbf:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00431cd8:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x7d5,"int AF_AActor_CanSeek(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_00431c2d;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00431cd8;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00431cbf;
LAB_00431c2d:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00431cf7;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00431cc8:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00431cf7;
  }
  target = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_00431c5c;
  }
  else {
    if (target != (AActor *)0x0) goto LAB_00431cc8;
LAB_00431c5c:
    NullParam("\"target\"");
    target = (AActor *)param[1].field_0.field_1.a;
    if (target == (AActor *)0x0) {
      target = (AActor *)0x0;
      goto LAB_00431c90;
    }
  }
  bVar1 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar3 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00431cf7:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x7d6,"int AF_AActor_CanSeek(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00431c90:
  bVar1 = AActor::CanSeek(this,target);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x7d7,
                    "int AF_AActor_CanSeek(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,(uint)bVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CanSeek)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(target, AActor);
	ACTION_RETURN_BOOL(self->CanSeek(target));
}